

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  XmlWriter *this_00;
  long in_FS_OFFSET;
  TestRunStats *in_stack_fffffffffffffe18;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  ScopedElement *in_stack_fffffffffffffe30;
  ScopedElement *this_01;
  undefined8 in_stack_fffffffffffffe38;
  XmlFormatting XVar1;
  string *in_stack_fffffffffffffe40;
  allocator *paVar2;
  XmlWriter *in_stack_fffffffffffffe48;
  undefined1 local_154 [2];
  allocator local_152;
  allocator local_151 [18];
  allocator local_13f;
  allocator local_13e;
  allocator local_13d [20];
  allocator local_129 [33];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  XVar1 = (XmlFormatting)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  StreamingReporterBase<Catch::XmlReporter>::testRunEnded
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"OverallResults",local_129);
  operator|(Newline,Indent);
  XmlWriter::scopedElement(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"successes",local_13d);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (unsigned_long *)in_stack_fffffffffffffe20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"failures",&local_13e);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (unsigned_long *)in_stack_fffffffffffffe20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"expectedFailures",&local_13f);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (unsigned_long *)in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)local_13d);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"OverallResultsCases",local_151);
  operator|(Newline,Indent);
  XmlWriter::scopedElement(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"successes",&local_152);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (unsigned_long *)in_stack_fffffffffffffe20);
  paVar2 = (allocator *)(local_154 + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"failures",paVar2);
  this_00 = (XmlWriter *)
            XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                      (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                       (unsigned_long *)in_stack_fffffffffffffe20);
  this_01 = (ScopedElement *)local_154;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"expectedFailures",(allocator *)this_01);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (this_01,in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20);
  XVar1 = (XmlFormatting)((ulong)this_01 >> 0x20);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)local_154);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(local_154 + 1));
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_152);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  operator|(Newline,Indent);
  XmlWriter::endElement(this_00,XVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testRunStats.totals.assertions.passed )
            .writeAttribute( "failures", testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testRunStats.totals.testCases.passed )
            .writeAttribute( "failures", testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }